

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O2

int __thiscall smf::Options::storeOption(Options *this,int gargp,int *position,int *running)

{
  int iVar1;
  pointer pbVar2;
  bool bVar3;
  char cVar4;
  long lVar5;
  long lVar6;
  pointer pcVar7;
  char *pcVar8;
  ostream *poVar9;
  long lVar10;
  allocator local_108a;
  allocator local_1089;
  long local_1088;
  int *local_1080;
  string local_1078;
  string local_1058;
  char tempname [4096];
  
  lVar10 = (long)gargp;
  if (*running == 0) {
    lVar6 = (long)gargp;
    pbVar2 = (this->m_oargv).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar7 = pbVar2[lVar6]._M_dataplus._M_p;
    local_1088 = lVar6;
    local_1080 = running;
    if (pcVar7[1] == this->m_optionFlag) {
      lVar10 = 2;
      lVar5 = 0;
      while( true ) {
        *position = (int)lVar10;
        cVar4 = pcVar7[lVar10];
        if ((cVar4 == '\0') || (cVar4 == '=')) break;
        tempname[lVar10 + -2] = cVar4;
        lVar10 = lVar10 + 1;
        pcVar7 = pbVar2[lVar6]._M_dataplus._M_p;
        lVar5 = lVar5 + 0x100000000;
      }
      tempname[lVar5 >> 0x20] = '\0';
      std::__cxx11::string::string((string *)&local_1078,tempname,(allocator *)&local_1058);
      cVar4 = getType(this,&local_1078);
      std::__cxx11::string::~string((string *)&local_1078);
      if (cVar4 == '\0') {
        this->m_optionsArgument = true;
        goto LAB_00118454;
      }
      running = local_1080;
      lVar10 = local_1088;
      if ((this->m_oargv).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar6]._M_dataplus._M_p[*position] == '=') {
        if (cVar4 == 'b') {
          poVar9 = std::operator<<((ostream *)&std::cerr,
                                   "Error: boolean variable cannot have any options: ");
          pcVar8 = tempname;
          goto LAB_00118554;
        }
        *position = *position + 1;
        bVar3 = false;
      }
      else {
        bVar3 = false;
      }
    }
    else {
      *position = 1;
      tempname[0] = pcVar7[1];
      tempname[1] = '\0';
      std::__cxx11::string::string((string *)&local_1078,tempname,(allocator *)&local_1058);
      cVar4 = getType(this,&local_1078);
      running = local_1080;
      std::__cxx11::string::~string((string *)&local_1078);
      if (cVar4 != 'b') goto LAB_001183d1;
      bVar3 = true;
      cVar4 = 'b';
      lVar10 = local_1088;
    }
  }
  else {
    iVar1 = *position;
    *position = iVar1 + 1;
    tempname[0] = (this->m_oargv).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar10]._M_dataplus._M_p
                  [(long)iVar1 + 1];
    tempname[1] = '\0';
    std::__cxx11::string::string((string *)&local_1078,tempname,(allocator *)&local_1058);
    cVar4 = getType(this,&local_1078);
    std::__cxx11::string::~string((string *)&local_1078);
    if (cVar4 == 'b') {
      bVar3 = true;
      cVar4 = 'b';
    }
    else {
      *running = 0;
LAB_001183d1:
      *position = *position + 1;
      if (cVar4 == '\0') {
LAB_00118454:
        this->m_optionsArgument = true;
        *position = 0;
        return gargp + 1;
      }
      bVar3 = true;
    }
  }
  lVar6 = (long)*position;
  pcVar7 = (this->m_oargv).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar10]._M_dataplus._M_p;
  if ((cVar4 == 'b') || (pcVar7[lVar6] != '\0')) {
    if (bVar3 && cVar4 == 'b') {
      if (pcVar7[lVar6 + 1] == '\0') {
LAB_001184be:
        if (pcVar7[lVar6 + 1] == '\0') {
          *running = 0;
        }
      }
      else {
        *running = 1;
      }
    }
    else if (cVar4 == 'b') goto LAB_001184be;
  }
  else {
    gargp = gargp + 1;
    *position = 0;
  }
  if (gargp < this->m_oargc) {
    std::__cxx11::string::string((string *)&local_1078,tempname,&local_1089);
    std::__cxx11::string::string
              ((string *)&local_1058,
               (this->m_oargv).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[gargp]._M_dataplus._M_p + *position,
               &local_108a);
    setModified(this,&local_1078,&local_1058);
    std::__cxx11::string::~string((string *)&local_1058);
    std::__cxx11::string::~string((string *)&local_1078);
    return gargp + (uint)(*running == 0);
  }
  poVar9 = (ostream *)&std::cerr;
  pcVar8 = "Error: last option requires a parameter";
LAB_00118554:
  poVar9 = std::operator<<(poVar9,pcVar8);
  std::endl<char,std::char_traits<char>>(poVar9);
  exit(1);
}

Assistant:

int Options::storeOption(int gargp, int& position, int& running) {
	int optionForm;
	char tempname[4096];
	char optionType = OPTION_TYPE_unknown;

	if (running) {
		optionForm = OPTION_FORM_continue;
	} else if (m_oargv[gargp][1] == getFlag()) {
		optionForm = OPTION_FORM_long;
	} else {
		optionForm = OPTION_FORM_short;
	}

	switch (optionForm) {
		case OPTION_FORM_continue:
			position++;
			tempname[0] = m_oargv[gargp][position];
			tempname[1] = '\0';
			optionType = getType(tempname);
			if (optionType != OPTION_TYPE_boolean) {
				running = 0;
				position++;
			}
			break;
		case OPTION_FORM_short:
			position = 1;
			tempname[0] = m_oargv[gargp][position];
			tempname[1] = '\0';
			optionType = getType(tempname);
			if (optionType != OPTION_TYPE_boolean) {
				position++;
			}
			break;
		case OPTION_FORM_long:
			position = 2;
			while (m_oargv[gargp][position] != '=' &&
					m_oargv[gargp][position] != '\0') {
				tempname[position-2] = m_oargv[gargp][position];
				position++;
			}
			tempname[position-2] = '\0';
			optionType = getType(tempname);
			if (optionType == OPTION_TYPE_unknown) { // suppressed --options option
				m_optionsArgument = 1;
				break;
			}
			if (m_oargv[gargp][position] == '=') {
				if (optionType == OPTION_TYPE_boolean) {
					std::cerr << "Error: boolean variable cannot have any options: "
					     << tempname << std::endl;
					exit(1);
				}
				position++;
			}
			break;
	}

	if (optionType == OPTION_TYPE_unknown) { // suppressed --options option
		m_optionsArgument = 1;
		gargp++;
		position = 0;
		return gargp;
	}

	if (m_oargv[gargp][position] == '\0' &&
			optionType != OPTION_TYPE_boolean) {
		gargp++;
		position = 0;
	}

	if ((optionForm != OPTION_FORM_long) && (optionType == OPTION_TYPE_boolean) &&
			(m_oargv[gargp][position+1] != '\0')) {
		running = 1;
	} else if ((optionType == OPTION_TYPE_boolean) &&
			(m_oargv[gargp][position+1] == '\0')) {
		running = 0;
	}

	if (gargp >= m_oargc) {
		std::cerr << "Error: last option requires a parameter" << std::endl;
		exit(1);
	}
	setModified(tempname, &m_oargv[gargp][position]);

	if (!running) {
		gargp++;
	}
	return gargp;
}